

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProj
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  long lVar1;
  char *pcVar2;
  DiagnosticStream DStack_1e8;
  
  if ((info->dim < Buffer) && (info->dim != Cube)) {
    if (info->multisampled == 0) {
      if (info->arrayed == 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1e8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar2 = "Expected Image \'arrayed\' parameter to be 0";
      lVar1 = 0x2a;
    }
    else {
      ValidationState_t::diag(&DStack_1e8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar2 = "Expected Image \'MS\' parameter to be 0";
      lVar1 = 0x25;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1e8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar2 = "Expected Image \'Dim\' parameter to be 1D, 2D, 3D or Rect";
    lVar1 = 0x37;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1e8,pcVar2,lVar1);
  DiagnosticStream::~DiagnosticStream(&DStack_1e8);
  return DStack_1e8.error_;
}

Assistant:

spv_result_t ValidateImageProj(ValidationState_t& _, const Instruction* inst,
                               const ImageTypeInfo& info) {
  if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
      info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Rect) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'Dim' parameter to be 1D, 2D, 3D or Rect";
  }

  if (info.multisampled != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'MS' parameter to be 0";
  }

  if (info.arrayed != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'arrayed' parameter to be 0";
  }

  return SPV_SUCCESS;
}